

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  byte bVar2;
  Curl_easy *pCVar3;
  uint uVar4;
  int iVar5;
  Curl_hash *pCVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  size_t key_len;
  ulong uVar10;
  Curl_easy **key;
  ulong __n;
  byte bVar11;
  Curl_multi *pCVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  uchar actions [5];
  curl_socket_t socks [5];
  undefined1 local_74 [4];
  Curl_easy *local_70;
  Curl_hash *local_68;
  Curl_multi *local_60;
  int local_54;
  byte local_4d [5];
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_70 = data;
  local_60 = multi;
  uVar4 = multi_getsock(data,local_48);
  local_68 = &multi->sockhash;
  uVar10 = 0;
  do {
    bVar11 = (byte)uVar10;
    uVar13 = 0x10000 << (bVar11 & 0x1f);
    if ((uVar4 >> (bVar11 & 0x1f) & 0x10001) == 0) goto LAB_0059d094;
    iVar5 = local_48[uVar10];
    local_74 = (undefined1  [4])iVar5;
    if (iVar5 == -1) {
      pCVar6 = (Curl_hash *)0x0;
    }
    else {
      pCVar6 = (Curl_hash *)Curl_hash_pick(local_68,local_74,4);
    }
    bVar15 = (1 << (bVar11 & 0x1f) & uVar4) != 0;
    bVar11 = bVar15 + 2;
    if ((uVar13 & uVar4) == 0) {
      bVar11 = bVar15;
    }
    local_4d[uVar10] = bVar11;
    if (pCVar6 == (Curl_hash *)0x0) {
      local_74 = (undefined1  [4])iVar5;
      local_54 = iVar5;
      if ((iVar5 == -1) ||
         (pCVar6 = (Curl_hash *)Curl_hash_pick(local_68,local_74,4), pCVar6 == (Curl_hash *)0x0)) {
        pCVar6 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
        if (pCVar6 == (Curl_hash *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_hash_init(pCVar6,0xd,trhash,trhash_compare,trhash_dtor);
        pvVar7 = Curl_hash_add(local_68,&local_54,4,pCVar6);
        if (pvVar7 == (void *)0x0) {
          Curl_hash_destroy(pCVar6);
          (*Curl_cfree)(pCVar6);
          return CURLM_OUT_OF_MEMORY;
        }
      }
    }
    else if (0 < (long)local_70->numsocks) {
      lVar9 = 0;
      do {
        if (iVar5 == local_70->sockets[lVar9]) {
          bVar2 = local_70->actions[lVar9];
          bVar15 = true;
          pCVar12 = local_60;
          if (bVar2 != bVar11) {
            if ((bVar2 & 1) != 0) {
              *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + -1;
            }
            if ((bVar2 & 2) != 0) {
              piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
              *piVar1 = *piVar1 + -1;
            }
            if ((bVar11 & 1) != 0) {
              *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + 1;
            }
            if ((uVar13 & uVar4) != 0) {
              piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          goto LAB_0059cfd7;
        }
        lVar9 = lVar9 + 1;
      } while (local_70->numsocks != lVar9);
    }
    pCVar12 = local_60;
    piVar1 = (int *)((long)&pCVar6[1].table + 4);
    *piVar1 = *piVar1 + 1;
    if ((bVar11 & 1) != 0) {
      *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + 1;
    }
    if ((uVar13 & uVar4) != 0) {
      piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
      *piVar1 = *piVar1 + 1;
    }
    pvVar7 = Curl_hash_add(pCVar6,&local_70,8,local_70);
    if (pvVar7 == (void *)0x0) {
      Curl_hash_destroy(pCVar6);
      return CURLM_OUT_OF_MEMORY;
    }
    bVar15 = false;
LAB_0059cfd7:
    iVar14 = (uint)(*(int *)&pCVar6[1].comp_func != 0) +
             (uint)(*(int *)((long)&pCVar6[1].comp_func + 4) != 0) * 2;
    if ((!bVar15) || (*(int *)&pCVar6[1].table != iVar14)) {
      if (pCVar12->socket_cb != (curl_socket_callback)0x0) {
        pCVar12->in_callback = true;
        iVar5 = (*pCVar12->socket_cb)
                          (local_70,iVar5,iVar14,pCVar12->socket_userp,pCVar6[1].hash_func);
        pCVar12->in_callback = false;
        if (iVar5 == -1) goto LAB_0059d1e4;
      }
      *(int *)&pCVar6[1].table = iVar14;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 5);
  uVar10 = 5;
LAB_0059d094:
  __n = uVar10 & 0xffffffff;
  if (0 < local_70->numsocks) {
    lVar9 = 0;
    do {
      pCVar12 = local_60;
      iVar5 = local_70->sockets[lVar9];
      if ((int)uVar10 != 0) {
        uVar8 = 0;
        do {
          if (iVar5 == local_48[uVar8]) goto LAB_0059d18a;
          uVar8 = uVar8 + 1;
        } while (__n != uVar8);
      }
      local_74 = (undefined1  [4])iVar5;
      if ((iVar5 != -1) &&
         (pCVar6 = (Curl_hash *)Curl_hash_pick(local_68,local_74,4), pCVar6 != (Curl_hash *)0x0)) {
        bVar11 = local_70->actions[lVar9];
        iVar14 = *(int *)((long)&pCVar6[1].table + 4) + -1;
        *(int *)((long)&pCVar6[1].table + 4) = iVar14;
        if ((bVar11 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar11 & 1) != 0) {
          *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + -1;
        }
        if (iVar14 == 0) {
          if (pCVar12->socket_cb != (curl_socket_callback)0x0) {
            pCVar12->in_callback = true;
            iVar14 = (*pCVar12->socket_cb)
                               (local_70,iVar5,4,pCVar12->socket_userp,pCVar6[1].hash_func);
            pCVar12->in_callback = false;
            if (iVar14 == -1) {
LAB_0059d1e4:
              pCVar12->dead = true;
              return CURLM_ABORTED_BY_CALLBACK;
            }
          }
          local_74 = (undefined1  [4])iVar5;
          Curl_hash_destroy(pCVar6);
          key_len = 4;
          key = (Curl_easy **)local_74;
          pCVar6 = local_68;
        }
        else {
          key_len = 8;
          key = &local_70;
        }
        Curl_hash_delete(pCVar6,key,key_len);
      }
LAB_0059d18a:
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_70->numsocks);
  }
  pCVar3 = local_70;
  memcpy(local_70->sockets,local_48,__n * 4);
  memcpy(pCVar3->actions,local_4d,__n);
  pCVar3->numsocks = (int)uVar10;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  unsigned char actions[MAX_SOCKSPEREASYHANDLE];
  int rc;

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned char action = CURL_POLL_NONE;
    unsigned char prevaction = 0;
    int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);
      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1) {
            multi->dead = TRUE;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(char));
  data->numsocks = num;
  return CURLM_OK;
}